

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

void __thiscall
ON_3dmObjectAttributes::ON_3dmObjectAttributes
          (ON_3dmObjectAttributes *this,ON_3dmObjectAttributes *src)

{
  long lVar1;
  ON_Plane *pOVar2;
  ON_Plane *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_Object::ON_Object(&this->super_ON_Object,&src->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_008174b0;
  (this->m_uuid).Data1 = 0;
  (this->m_uuid).Data2 = 0;
  (this->m_uuid).Data3 = 0;
  (this->m_uuid).Data4[0] = '\0';
  (this->m_uuid).Data4[1] = '\0';
  (this->m_uuid).Data4[2] = '\0';
  (this->m_uuid).Data4[3] = '\0';
  (this->m_uuid).Data4[4] = '\0';
  (this->m_uuid).Data4[5] = '\0';
  (this->m_uuid).Data4[6] = '\0';
  (this->m_uuid).Data4[7] = '\0';
  ON_wString::ON_wString(&this->m_name);
  ON_wString::ON_wString(&this->m_url);
  this->m_layer_index = 0;
  this->m_linetype_index = -1;
  this->m_material_index = -1;
  ON_ObjectRenderingAttributes::ON_ObjectRenderingAttributes(&this->m_rendering_attributes);
  ON_Color::ON_Color(&this->m_color,0,0,0);
  ON_Color::ON_Color(&this->m_plot_color,0,0,0);
  this->m_display_order = 0;
  this->m_plot_weight_mm = 0.0;
  this->m_object_decoration = no_object_decoration;
  this->m_wire_density = 1;
  (this->m_viewport_id).Data1 = 0;
  (this->m_viewport_id).Data2 = 0;
  (this->m_viewport_id).Data3 = 0;
  (this->m_viewport_id).Data4[0] = '\0';
  (this->m_viewport_id).Data4[1] = '\0';
  (this->m_viewport_id).Data4[2] = '\0';
  (this->m_viewport_id).Data4[3] = '\0';
  (this->m_viewport_id).Data4[4] = '\0';
  (this->m_viewport_id).Data4[5] = '\0';
  (this->m_viewport_id).Data4[6] = '\0';
  (this->m_viewport_id).Data4[7] = '\0';
  this->m_space = model_space;
  this->m_bVisible = true;
  this->m_mode = '\0';
  this->m_color_source = '\0';
  this->m_plot_color_source = '\0';
  this->m_plot_weight_source = '\0';
  this->m_plot_weight_source = '\0';
  this->m_material_source = '\0';
  this->m_linetype_source = '\0';
  this->m_reserved_0 = '\0';
  pOVar2 = &ON_Plane::UnsetPlane;
  pOVar3 = &this->m_object_frame;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->origin).x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->m_group)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  (this->m_group).m_a = (int *)0x0;
  (this->m_group).m_count = 0;
  (this->m_group).m_capacity = 0;
  this->m_private = (ON_3dmObjectAttributesPrivate *)0x0;
  (this->m_dmref)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176e8;
  (this->m_dmref).m_a = (ON_DisplayMaterialRef *)0x0;
  (this->m_dmref).m_count = 0;
  (this->m_dmref).m_capacity = 0;
  CopyHelper(this,src);
  return;
}

Assistant:

ON_3dmObjectAttributes::ON_3dmObjectAttributes(const ON_3dmObjectAttributes& src) 
  : ON_Object(src)
  , m_color(0, 0, 0)
  , m_plot_color(0, 0, 0)
{
  CopyHelper(src);
}